

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O0

vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_> *
__thiscall
spvtools::opt::SENode::CollectValueUnknownNodes
          (vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
           *__return_storage_ptr__,SENode *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ChildContainerType *this_00;
  reference ppSVar3;
  iterator __first;
  iterator __last;
  __normal_iterator<spvtools::opt::SEValueUnknown_**,_std::vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>_>
  local_70;
  const_iterator local_68;
  undefined1 local_60 [8];
  vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  child_value_unknown_nodes;
  SENode *child;
  iterator __end2;
  iterator __begin2;
  ChildContainerType *__range2;
  SEValueUnknown *value_unknown_node;
  SENode *local_18;
  SENode *this_local;
  vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  *value_unknown_nodes;
  
  value_unknown_node._7_1_ = 0;
  local_18 = this;
  this_local = (SENode *)__return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x18);
  std::vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>::
  vector(__return_storage_ptr__);
  iVar2 = (*this->_vptr_SENode[0xe])();
  __range2 = (ChildContainerType *)CONCAT44(extraout_var,iVar2);
  if (__range2 != (ChildContainerType *)0x0) {
    std::vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>::
    push_back(__return_storage_ptr__,(value_type *)&__range2);
  }
  this_00 = GetChildren(this);
  __end2 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::begin
                     (this_00);
  child = (SENode *)
          std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::end
                    (this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                     *)&child), bVar1) {
    ppSVar3 = __gnu_cxx::
              __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
              ::operator*(&__end2);
    child_value_unknown_nodes.
    super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppSVar3;
    CollectValueUnknownNodes
              ((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                *)local_60,
               (SENode *)
               child_value_unknown_nodes.
               super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_70._M_current =
         (SEValueUnknown **)
         std::
         vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>::
         end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SEValueUnknown*const*,std::vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>>
    ::__normal_iterator<spvtools::opt::SEValueUnknown**>
              ((__normal_iterator<spvtools::opt::SEValueUnknown*const*,std::vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>>
                *)&local_68,&local_70);
    __first = std::
              vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
              ::begin((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                       *)local_60);
    __last = std::
             vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
             ::end((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                    *)local_60);
    std::vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>::
    insert<__gnu_cxx::__normal_iterator<spvtools::opt::SEValueUnknown**,std::vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>>,void>
              ((vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>
                *)__return_storage_ptr__,local_68,
               (__normal_iterator<spvtools::opt::SEValueUnknown_**,_std::vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>_>
                )__first._M_current,
               (__normal_iterator<spvtools::opt::SEValueUnknown_**,_std::vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>_>
                )__last._M_current);
    std::vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>::
    ~vector((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
             *)local_60);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SEValueUnknown*> CollectValueUnknownNodes() {
    std::vector<SEValueUnknown*> value_unknown_nodes{};

    if (auto value_unknown_node = AsSEValueUnknown()) {
      value_unknown_nodes.push_back(value_unknown_node);
    }

    for (auto child : GetChildren()) {
      auto child_value_unknown_nodes = child->CollectValueUnknownNodes();
      value_unknown_nodes.insert(value_unknown_nodes.end(),
                                 child_value_unknown_nodes.begin(),
                                 child_value_unknown_nodes.end());
    }

    return value_unknown_nodes;
  }